

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Prepare(sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pReprepare,
                  sqlite3_stmt **ppStmt,char **pzTail)

{
  int *piVar1;
  int iVar2;
  VTable *pVVar3;
  Btree *p;
  Mem *p_00;
  bool bVar4;
  Vdbe *pVVar5;
  u8 uVar6;
  int err_code;
  char *pcVar7;
  long lVar8;
  VTable *pVTab;
  ulong n;
  long lVar9;
  long in_FS_OFFSET;
  Parse sParse;
  Parse local_1e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_1e0,0xaa,0x1a8);
  memset(&local_1e0.zErrMsg,0,0xe0);
  memset(&local_1e0.sLastToken,0,0x88);
  local_1e0.pOuterParse = db->pParse;
  db->pParse = &local_1e0;
  if (pReprepare != (Vdbe *)0x0) {
    local_1e0.explain = (byte)pReprepare->field_0xc8 >> 2 & 3;
    local_1e0.pReprepare = pReprepare;
  }
  local_1e0.db = db;
  if (db->mallocFailed == '\0') {
    if ((prepFlags & 1) != 0) {
      local_1e0.disableLookaside = local_1e0.disableLookaside + '\x01';
      (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
      (db->lookaside).sz = 0;
    }
    uVar6 = (u8)prepFlags;
    err_code = 0;
    local_1e0.prepFlags = uVar6;
    if ((db->noSharedCache == '\0') && (err_code = 0, 0 < db->nDb)) {
      lVar9 = 0;
      lVar8 = 0;
      err_code = 0;
      do {
        p = *(Btree **)((long)&db->aDb->pBt + lVar9);
        bVar4 = true;
        if (p != (Btree *)0x0) {
          if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
            btreeLockCarefully(p);
          }
          err_code = querySharedCacheTableLock(p,1,'\x01');
          if (p->sharable != '\0') {
            piVar1 = &p->wantToLock;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              unlockBtreeMutex(p);
            }
          }
          if (err_code == 0) {
            err_code = 0;
          }
          else {
            bVar4 = false;
            sqlite3ErrorWithMsg(db,err_code,"database schema is locked: %s",
                                *(undefined8 *)((long)&db->aDb->zDbSName + lVar9));
          }
        }
        if (!bVar4) goto LAB_0015c7ac;
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 0x20;
      } while (lVar8 < db->nDb);
    }
    pVTab = db->pDisconnect;
    if (pVTab != (VTable *)0x0) {
      db->pDisconnect = (VTable *)0x0;
      do {
        pVVar3 = pVTab->pNext;
        sqlite3VtabUnlock(pVTab);
        pVTab = pVVar3;
      } while (pVVar3 != (VTable *)0x0);
    }
    if ((nBytes < 0) || ((n = (ulong)(uint)nBytes, nBytes != 0 && (zSql[n - 1] == '\0')))) {
      sqlite3RunParser(&local_1e0,zSql);
    }
    else {
      iVar2 = db->aLimit[1];
      if (iVar2 < nBytes) {
        sqlite3ErrorWithMsg(db,0x12,"statement too long");
        err_code = apiHandleError(db,0x12);
      }
      else {
        pcVar7 = sqlite3DbStrNDup(db,zSql,n);
        if (pcVar7 == (char *)0x0) {
          local_1e0.zTail = zSql + n;
        }
        else {
          sqlite3RunParser(&local_1e0,pcVar7);
          local_1e0.zTail = zSql + ((long)local_1e0.zTail - (long)pcVar7);
          sqlite3DbFreeNN(db,pcVar7);
        }
      }
      if (iVar2 < nBytes) goto LAB_0015c7ac;
    }
    pVVar5 = local_1e0.pVdbe;
    if (pzTail != (char **)0x0) {
      *pzTail = local_1e0.zTail;
    }
    if (((db->init).busy == '\0') && (local_1e0.pVdbe != (Vdbe *)0x0)) {
      (local_1e0.pVdbe)->prepFlags = uVar6;
      if (-1 < (char)uVar6) {
        (local_1e0.pVdbe)->expmask = 0;
      }
      pcVar7 = sqlite3DbStrNDup((local_1e0.pVdbe)->db,zSql,(long)((int)local_1e0.zTail - (int)zSql))
      ;
      pVVar5->zSql = pcVar7;
    }
    if (db->mallocFailed != '\0') {
      local_1e0.rc = 7;
      local_1e0.checkSchema = '\0';
    }
    if ((local_1e0.rc == 0) || (local_1e0.rc == 0x65)) {
      *ppStmt = (sqlite3_stmt *)local_1e0.pVdbe;
      db->errCode = 0;
      db->errByteOffset = -1;
      p_00 = db->pErr;
      err_code = 0;
      if (p_00 != (Mem *)0x0) {
        if ((p_00->flags & 0x9000) == 0) {
          p_00->flags = 1;
          err_code = 0;
        }
        else {
          vdbeMemClearExternAndSetNull(p_00);
        }
      }
    }
    else {
      if ((local_1e0.checkSchema != '\0') && ((db->init).busy == '\0')) {
        schemaIsValid(&local_1e0);
      }
      if (local_1e0.pVdbe != (Vdbe *)0x0) {
        sqlite3VdbeFinalize(local_1e0.pVdbe);
      }
      err_code = local_1e0.rc;
      if ((TriggerPrg *)local_1e0.zErrMsg == (TriggerPrg *)0x0) {
        db->errCode = local_1e0.rc;
        if ((local_1e0.rc == 0) && (db->pErr == (sqlite3_value *)0x0)) {
          db->errByteOffset = -1;
        }
        else {
          sqlite3ErrorFinish(db,local_1e0.rc);
        }
      }
      else {
        sqlite3ErrorWithMsg(db,local_1e0.rc,"%s");
        if ((TriggerPrg *)local_1e0.zErrMsg != (TriggerPrg *)0x0) goto LAB_0015c797;
      }
    }
    while (local_1e0.pTriggerPrg != (TriggerPrg *)0x0) {
      local_1e0.zErrMsg = (char *)local_1e0.pTriggerPrg;
      local_1e0.pTriggerPrg = (local_1e0.pTriggerPrg)->pNext;
LAB_0015c797:
      sqlite3DbFreeNN(db,local_1e0.zErrMsg);
    }
  }
  else {
    sqlite3ErrorMsg(&local_1e0,"out of memory");
    db->errCode = 7;
    err_code = 7;
  }
LAB_0015c7ac:
  sqlite3ParseObjectReset(&local_1e0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return err_code;
}

Assistant:

static int sqlite3Prepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pReprepare,         /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc = SQLITE_OK;       /* Result code */
  int i;                    /* Loop counter */
  Parse sParse;             /* Parsing context */

  /* sqlite3ParseObjectInit(&sParse, db); // inlined for performance */
  memset(PARSE_HDR(&sParse), 0, PARSE_HDR_SZ);
  memset(PARSE_TAIL(&sParse), 0, PARSE_TAIL_SZ);
  sParse.pOuterParse = db->pParse;
  db->pParse = &sParse;
  sParse.db = db;
  if( pReprepare ){
    sParse.pReprepare = pReprepare;
    sParse.explain = sqlite3_stmt_isexplain((sqlite3_stmt*)pReprepare);
  }else{
    assert( sParse.pReprepare==0 );
  }
  assert( ppStmt && *ppStmt==0 );
  if( db->mallocFailed ){
    sqlite3ErrorMsg(&sParse, "out of memory");
    db->errCode = rc = SQLITE_NOMEM;
    goto end_prepare;
  }
  assert( sqlite3_mutex_held(db->mutex) );

  /* For a long-term use prepared statement avoid the use of
  ** lookaside memory.
  */
  if( prepFlags & SQLITE_PREPARE_PERSISTENT ){
    sParse.disableLookaside++;
    DisableLookaside;
  }
  sParse.prepFlags = prepFlags & 0xff;

  /* Check to verify that it is possible to get a read lock on all
  ** database schemas.  The inability to get a read lock indicates that
  ** some other database connection is holding a write-lock, which in
  ** turn means that the other connection has made uncommitted changes
  ** to the schema.
  **
  ** Were we to proceed and prepare the statement against the uncommitted
  ** schema changes and if those schema changes are subsequently rolled
  ** back and different changes are made in their place, then when this
  ** prepared statement goes to run the schema cookie would fail to detect
  ** the schema change.  Disaster would follow.
  **
  ** This thread is currently holding mutexes on all Btrees (because
  ** of the sqlite3BtreeEnterAll() in sqlite3LockAndPrepare()) so it
  ** is not possible for another thread to start a new schema change
  ** while this routine is running.  Hence, we do not need to hold
  ** locks on the schema, we just need to make sure nobody else is
  ** holding them.
  **
  ** Note that setting READ_UNCOMMITTED overrides most lock detection,
  ** but it does *not* override schema lock detection, so this all still
  ** works even if READ_UNCOMMITTED is set.
  */
  if( !db->noSharedCache ){
    for(i=0; i<db->nDb; i++) {
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        assert( sqlite3BtreeHoldsMutex(pBt) );
        rc = sqlite3BtreeSchemaLocked(pBt);
        if( rc ){
          const char *zDb = db->aDb[i].zDbSName;
          sqlite3ErrorWithMsg(db, rc, "database schema is locked: %s", zDb);
          testcase( db->flags & SQLITE_ReadUncommit );
          goto end_prepare;
        }
      }
    }
  }

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( db->pDisconnect ) sqlite3VtabUnlockList(db);
#endif

  if( nBytes>=0 && (nBytes==0 || zSql[nBytes-1]!=0) ){
    char *zSqlCopy;
    int mxLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
    testcase( nBytes==mxLen );
    testcase( nBytes==mxLen+1 );
    if( nBytes>mxLen ){
      sqlite3ErrorWithMsg(db, SQLITE_TOOBIG, "statement too long");
      rc = sqlite3ApiExit(db, SQLITE_TOOBIG);
      goto end_prepare;
    }
    zSqlCopy = sqlite3DbStrNDup(db, zSql, nBytes);
    if( zSqlCopy ){
      sqlite3RunParser(&sParse, zSqlCopy);
      sParse.zTail = &zSql[sParse.zTail-zSqlCopy];
      sqlite3DbFree(db, zSqlCopy);
    }else{
      sParse.zTail = &zSql[nBytes];
    }
  }else{
    sqlite3RunParser(&sParse, zSql);
  }
  assert( 0==sParse.nQueryLoop );

  if( pzTail ){
    *pzTail = sParse.zTail;
  }

  if( db->init.busy==0 ){
    sqlite3VdbeSetSql(sParse.pVdbe, zSql, (int)(sParse.zTail-zSql), prepFlags);
  }
  if( db->mallocFailed ){
    sParse.rc = SQLITE_NOMEM_BKPT;
    sParse.checkSchema = 0;
  }
  if( sParse.rc!=SQLITE_OK && sParse.rc!=SQLITE_DONE ){
    if( sParse.checkSchema && db->init.busy==0 ){
      schemaIsValid(&sParse);
    }
    if( sParse.pVdbe ){
      sqlite3VdbeFinalize(sParse.pVdbe);
    }
    assert( 0==(*ppStmt) );
    rc = sParse.rc;
    if( sParse.zErrMsg ){
      sqlite3ErrorWithMsg(db, rc, "%s", sParse.zErrMsg);
      sqlite3DbFree(db, sParse.zErrMsg);
    }else{
      sqlite3Error(db, rc);
    }
  }else{
    assert( sParse.zErrMsg==0 );
    *ppStmt = (sqlite3_stmt*)sParse.pVdbe;
    rc = SQLITE_OK;
    sqlite3ErrorClear(db);
  }


  /* Delete any TriggerPrg structures allocated while parsing this statement. */
  while( sParse.pTriggerPrg ){
    TriggerPrg *pT = sParse.pTriggerPrg;
    sParse.pTriggerPrg = pT->pNext;
    sqlite3DbFree(db, pT);
  }

end_prepare:

  sqlite3ParseObjectReset(&sParse);
  return rc;
}